

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapOneofField<true>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  uint32_t number;
  uint32_t uVar2;
  CppStringType CVar3;
  int32_t v;
  int v_00;
  FieldDescriptor *this_00;
  Message *v_01;
  uint64_t v_02;
  int64_t v_03;
  Cord *v_04;
  ArenaStringPtr v_05;
  uint32_t *puVar4;
  LogMessage *pLVar5;
  float fVar6;
  double v_06;
  MessageWrapper local_b8;
  MessageWrapper local_a0;
  FieldDescriptor *local_88;
  uint32_t local_7c;
  LogMessageFatal local_78 [20];
  CppType local_64;
  LocalVarWrapper temp;
  
  bVar1 = OneofDescriptor::is_synthetic(oneof_descriptor);
  if (bVar1) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&temp,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x409,0x21,"!oneof_descriptor->is_synthetic()");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
  }
  number = GetOneofCase(this,lhs,oneof_descriptor);
  local_7c = GetOneofCase(this,rhs,oneof_descriptor);
  temp.string_val._M_dataplus._M_p = (pointer)&temp.string_val.field_2;
  temp.string_val._M_string_length = 0;
  temp.string_val.field_2._M_local_buf[0] = '\0';
  if (number == 0) {
    local_88 = (FieldDescriptor *)0x0;
    goto LAB_002515de;
  }
  local_a0.field = Descriptor::FindFieldByNumber(this->descriptor_,number);
  local_88 = local_a0.field;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(local_a0.field)->type_ * 4)) {
  case 1:
    local_a0.reflection = this;
    local_a0.message = lhs;
    uVar2 = SwapOneofField<true>::MessageWrapper::GetInt32(&local_a0);
    goto LAB_0025156c;
  case 2:
    local_a0.reflection = this;
    local_a0.message = lhs;
    temp.oneof_val.type_int64 = SwapOneofField<true>::MessageWrapper::GetInt64(&local_a0);
    break;
  case 3:
    local_a0.reflection = this;
    local_a0.message = lhs;
    uVar2 = SwapOneofField<true>::MessageWrapper::GetUint32(&local_a0);
    goto LAB_0025156c;
  case 4:
    local_a0.reflection = this;
    local_a0.message = lhs;
    temp.oneof_val.type_uint64 = SwapOneofField<true>::MessageWrapper::GetUint64(&local_a0);
    break;
  case 5:
    local_a0.reflection = this;
    local_a0.message = lhs;
    temp.oneof_val.type_double = SwapOneofField<true>::MessageWrapper::GetDouble(&local_a0);
    break;
  case 6:
    local_a0.reflection = this;
    local_a0.message = lhs;
    fVar6 = SwapOneofField<true>::MessageWrapper::GetFloat(&local_a0);
    temp.oneof_val.type_float = fVar6;
    break;
  case 7:
    local_a0.reflection = this;
    local_a0.message = lhs;
    bVar1 = SwapOneofField<true>::MessageWrapper::GetBool(&local_a0);
    temp.oneof_val.type_bool = bVar1;
    break;
  case 8:
    local_a0.reflection = this;
    local_a0.message = lhs;
    uVar2 = SwapOneofField<true>::MessageWrapper::GetEnum(&local_a0);
LAB_0025156c:
    temp.oneof_val.type_enum = uVar2;
    break;
  case 9:
    local_a0.reflection = this;
    local_a0.message = lhs;
    CVar3 = FieldDescriptor::cpp_string_type(local_a0.field);
    if ((CVar3 == kView) || (CVar3 == kString)) {
      temp.oneof_val.type_arena_string_ptr =
           SwapOneofField<true>::MessageWrapper::GetArenaStringPtr(&local_a0);
    }
    else if (CVar3 == kCord) {
      temp.oneof_val.type_cord = SwapOneofField<true>::MessageWrapper::GetCord(&local_a0);
    }
    break;
  case 10:
    local_a0.reflection = this;
    local_a0.message = lhs;
    temp.oneof_val.type_message = SwapOneofField<true>::MessageWrapper::UnsafeGetMessage(&local_a0);
    break;
  default:
    local_a0.reflection = this;
    local_a0.message = lhs;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x23c);
    pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       ((LogMessage *)local_78,(char (*) [21])"unimplemented type: ");
    local_64 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_88->type_ * 4);
    absl::lts_20240722::log_internal::LogMessage::
    operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(pLVar5,&local_64);
    goto LAB_002519e3;
  }
  SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_a0);
LAB_002515de:
  if (local_7c != 0) {
    this_00 = Descriptor::FindFieldByNumber(this->descriptor_,local_7c);
    local_b8.field = this_00;
    local_a0.field = this_00;
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4)) {
    case 1:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      v = SwapOneofField<true>::MessageWrapper::GetInt32(&local_b8);
      SwapOneofField<true>::MessageWrapper::SetInt32(&local_a0,v);
      break;
    case 2:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      v_03 = SwapOneofField<true>::MessageWrapper::GetInt64(&local_b8);
      SwapOneofField<true>::MessageWrapper::SetInt64(&local_a0,v_03);
      break;
    case 3:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      uVar2 = SwapOneofField<true>::MessageWrapper::GetUint32(&local_b8);
      SwapOneofField<true>::MessageWrapper::SetUint32(&local_a0,uVar2);
      break;
    case 4:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      v_02 = SwapOneofField<true>::MessageWrapper::GetUint64(&local_b8);
      SwapOneofField<true>::MessageWrapper::SetUint64(&local_a0,v_02);
      break;
    case 5:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      v_06 = SwapOneofField<true>::MessageWrapper::GetDouble(&local_b8);
      SwapOneofField<true>::MessageWrapper::SetDouble(&local_a0,v_06);
      break;
    case 6:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      fVar6 = SwapOneofField<true>::MessageWrapper::GetFloat(&local_b8);
      SwapOneofField<true>::MessageWrapper::SetFloat(&local_a0,fVar6);
      break;
    case 7:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      bVar1 = SwapOneofField<true>::MessageWrapper::GetBool(&local_b8);
      SwapOneofField<true>::MessageWrapper::SetBool(&local_a0,bVar1);
      break;
    case 8:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      v_00 = SwapOneofField<true>::MessageWrapper::GetEnum(&local_b8);
      SwapOneofField<true>::MessageWrapper::SetEnum(&local_a0,v_00);
      break;
    case 9:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      CVar3 = FieldDescriptor::cpp_string_type(this_00);
      if ((CVar3 == kView) || (CVar3 == kString)) {
        v_05 = SwapOneofField<true>::MessageWrapper::GetArenaStringPtr(&local_b8);
        SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
        ::ArenaStringPtr_(&local_a0,v_05);
      }
      else if (CVar3 == kCord) {
        v_04 = SwapOneofField<true>::MessageWrapper::GetCord(&local_b8);
        SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
        ::Cord__(&local_a0,v_04);
      }
      break;
    case 10:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      v_01 = SwapOneofField<true>::MessageWrapper::UnsafeGetMessage(&local_b8);
      SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::Message__(&local_a0,v_01);
      break;
    default:
      local_b8.reflection = this;
      local_b8.message = rhs;
      local_a0.reflection = this;
      local_a0.message = lhs;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x23c);
      pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         ((LogMessage *)local_78,(char (*) [21])"unimplemented type: ");
      local_64 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4);
      absl::lts_20240722::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(pLVar5,&local_64);
      goto LAB_002519e3;
    }
    SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_b8);
  }
  if (number != 0) {
    local_b8.field = local_88;
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_88->type_ * 4)) {
    case 1:
      local_b8.reflection = this;
      local_b8.message = rhs;
      SwapOneofField<true>::MessageWrapper::SetInt32(&local_b8,temp.oneof_val.type_int32);
      break;
    case 2:
      local_b8.reflection = this;
      local_b8.message = rhs;
      SwapOneofField<true>::MessageWrapper::SetInt64(&local_b8,temp.oneof_val.type_int64);
      break;
    case 3:
      local_b8.reflection = this;
      local_b8.message = rhs;
      SwapOneofField<true>::MessageWrapper::SetUint32(&local_b8,temp.oneof_val.type_uint32);
      break;
    case 4:
      local_b8.reflection = this;
      local_b8.message = rhs;
      SwapOneofField<true>::MessageWrapper::SetUint64(&local_b8,temp.oneof_val.type_uint64);
      break;
    case 5:
      local_b8.reflection = this;
      local_b8.message = rhs;
      SwapOneofField<true>::MessageWrapper::SetDouble(&local_b8,temp.oneof_val.type_double);
      break;
    case 6:
      local_b8.reflection = this;
      local_b8.message = rhs;
      SwapOneofField<true>::MessageWrapper::SetFloat(&local_b8,temp.oneof_val.type_float);
      break;
    case 7:
      local_b8.reflection = this;
      local_b8.message = rhs;
      SwapOneofField<true>::MessageWrapper::SetBool(&local_b8,temp.oneof_val.type_bool);
      break;
    case 8:
      local_b8.reflection = this;
      local_b8.message = rhs;
      SwapOneofField<true>::MessageWrapper::SetEnum(&local_b8,temp.oneof_val.type_enum);
      break;
    case 9:
      local_b8.reflection = this;
      local_b8.message = rhs;
      CVar3 = FieldDescriptor::cpp_string_type(local_88);
      if ((CVar3 == kView) || (CVar3 == kString)) {
        SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
        ::ArenaStringPtr_(&local_b8,temp.oneof_val.type_arena_string_ptr.tagged_ptr_.ptr_);
      }
      else if (CVar3 == kCord) {
        SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
        ::Cord__(&local_b8,temp.oneof_val.type_cord);
      }
      break;
    case 10:
      local_b8.reflection = this;
      local_b8.message = rhs;
      SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::Message__(&local_b8,temp.oneof_val.type_message);
      break;
    default:
      local_b8.reflection = this;
      local_b8.message = rhs;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x23c);
      pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         ((LogMessage *)local_78,(char (*) [21])"unimplemented type: ");
      local_64 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_88->type_ * 4);
      absl::lts_20240722::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(pLVar5,&local_64);
LAB_002519e3:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
    }
  }
  puVar4 = MutableOneofCase(this,lhs,oneof_descriptor);
  *puVar4 = local_7c;
  puVar4 = MutableOneofCase(this,rhs,oneof_descriptor);
  *puVar4 = number;
  std::__cxx11::string::~string((string *)&temp.string_val);
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    LOCAL_VAR_ACCESSOR(absl::Cord*, cord, Cord);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
      absl::Cord* type_cord;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    MESSAGE_FIELD_ACCESSOR(absl::Cord*, cord, Cord);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  ABSL_DCHECK(!oneof_descriptor->is_synthetic());
  uint32_t oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32_t oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}